

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O3

int rhash_msg(uint hash_id,void *message,size_t length,uchar *result)

{
  int iVar1;
  rhash ctx;
  
  ctx = rhash_init(hash_id & 0x3ff);
  if (ctx == (rhash)0x0) {
    iVar1 = -1;
  }
  else {
    rhash_update(ctx,message,length);
    rhash_final(ctx,result);
    rhash_free(ctx);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

RHASH_API int rhash_msg(unsigned hash_id, const void* message, size_t length, unsigned char* result)
{
	rhash ctx;
	hash_id &= RHASH_ALL_HASHES;
	ctx = rhash_init(hash_id);
	if (ctx == NULL) return -1;
	rhash_update(ctx, message, length);
	rhash_final(ctx, result);
	rhash_free(ctx);
	return 0;
}